

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PanicHandler.cpp
# Opt level: O0

char * xercesc_4_0::PanicHandler::getPanicReasonString(PanicReasons reason)

{
  char *local_18;
  char *reasonStr;
  PanicReasons reason_local;
  
  switch(reason) {
  case Panic_NoTransService:
    local_18 = "Could not load a transcoding service";
    break;
  case Panic_NoDefTranscoder:
    local_18 = "Could not load a local code page transcoder";
    break;
  case Panic_CantFindLib:
    local_18 = "Could not find the xerces-c DLL";
    break;
  case Panic_UnknownMsgDomain:
    local_18 = "Unknown message domain";
    break;
  case Panic_CantLoadMsgDomain:
    local_18 = "Cannot load message domain";
    break;
  case Panic_SynchronizationErr:
    local_18 = "Cannot synchronize system or mutex";
    break;
  case Panic_SystemInit:
    local_18 = "Cannot initialize the system or mutex";
    break;
  default:
    local_18 = "Unknown reason";
    break;
  case Panic_MutexErr:
    local_18 = "Cannot create, lock or unlock a mutex";
  }
  return local_18;
}

Assistant:

const char* PanicHandler::getPanicReasonString(const PanicReasons reason)
{
    const char* reasonStr;

    switch (reason)
    {
    case Panic_NoTransService:
        reasonStr = "Could not load a transcoding service";
        break;
    case Panic_NoDefTranscoder:
        reasonStr = "Could not load a local code page transcoder";
        break;
    case Panic_CantFindLib:
        reasonStr = "Could not find the xerces-c DLL";
        break;
    case Panic_UnknownMsgDomain:
        reasonStr = "Unknown message domain";
        break;
    case Panic_CantLoadMsgDomain:
        reasonStr = "Cannot load message domain";
        break;
    case Panic_SynchronizationErr:
        reasonStr = "Cannot synchronize system or mutex";
        break;
    case Panic_SystemInit:
        reasonStr = "Cannot initialize the system or mutex";
        break;
    case Panic_MutexErr:
        reasonStr = "Cannot create, lock or unlock a mutex";
        break;
    default:
        reasonStr = "Unknown reason";
        break;
    }	

    return reasonStr;

}